

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_expression_rec
          (xpath_parser *this,xpath_ast_node *lhs,int limit)

{
  xpath_lexer *lexer;
  xpath_parse_result *pxVar1;
  bool bVar2;
  xpath_ast_node *lhs_00;
  xpath_ast_node *pxVar3;
  binary_op_t bVar4;
  binary_op_t bVar5;
  
  lexer = &this->_lexer;
  bVar4 = binary_op_t::parse(lexer);
  do {
    if (bVar4.asttype == ast_unknown) {
      return lhs;
    }
    if (bVar4.precedence < limit) {
      return lhs;
    }
    xpath_lexer::next(lexer);
    for (lhs_00 = parse_path_or_unary_expression(this); lhs_00 != (xpath_ast_node *)0x0;
        lhs_00 = parse_expression_rec(this,lhs_00,bVar5.precedence)) {
      bVar5 = binary_op_t::parse(lexer);
      if ((bVar5.asttype == ast_unknown) || (bVar5.precedence <= bVar4.precedence)) {
        if ((bVar4.asttype != ast_op_union) ||
           ((lhs->_rettype == '\x01' && (lhs_00->_rettype == '\x01')))) {
          pxVar3 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar3 == (xpath_ast_node *)0x0) {
            lhs = (xpath_ast_node *)0x0;
          }
          else {
            pxVar3->_type = (char)bVar4.asttype;
            pxVar3->_rettype = (char)bVar4.rettype;
            pxVar3->_axis = '\0';
            pxVar3->_test = '\0';
            pxVar3->_left = lhs;
            pxVar3->_right = lhs_00;
            pxVar3->_next = (xpath_ast_node *)0x0;
            lhs = pxVar3;
          }
          if (lhs == (xpath_ast_node *)0x0) {
            bVar2 = false;
            lhs = (xpath_ast_node *)0x0;
          }
          else {
            bVar4 = binary_op_t::parse(lexer);
            bVar2 = true;
          }
          goto LAB_00113510;
        }
        pxVar1 = this->_result;
        pxVar1->error = "Union operator has to be applied to node sets";
        pxVar1->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
        break;
      }
    }
    bVar2 = false;
LAB_00113510:
    if (!bVar2) {
      return (xpath_ast_node *)0x0;
    }
  } while( true );
}

Assistant:

xpath_ast_node* parse_expression_rec(xpath_ast_node* lhs, int limit)
		{
			binary_op_t op = binary_op_t::parse(_lexer);

			while (op.asttype != ast_unknown && op.precedence >= limit)
			{
				_lexer.next();

				xpath_ast_node* rhs = parse_path_or_unary_expression();
				if (!rhs) return 0;

				binary_op_t nextop = binary_op_t::parse(_lexer);

				while (nextop.asttype != ast_unknown && nextop.precedence > op.precedence)
				{
					rhs = parse_expression_rec(rhs, nextop.precedence);
					if (!rhs) return 0;

					nextop = binary_op_t::parse(_lexer);
				}

				if (op.asttype == ast_op_union && (lhs->rettype() != xpath_type_node_set || rhs->rettype() != xpath_type_node_set))
					return error("Union operator has to be applied to node sets");

				lhs = alloc_node(op.asttype, op.rettype, lhs, rhs);
				if (!lhs) return 0;

				op = binary_op_t::parse(_lexer);
			}

			return lhs;
		}